

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::verifySubroutineUniformValuesForShaderStage
          (FunctionalTest16 *this,_shader_stage *shader_stage,
          _subroutine_uniform_value_verification *verification)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLenum shader_stage_glenum;
  GLenum shader_stage_glenum_00;
  GLenum shader_stage_glenum_01;
  GLuint result_values [4];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  string local_1c8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_1d8 = 0;
  uStack_1d0 = 0;
  (**(code **)(lVar3 + 0xb50))(shader_stage->gl_stage,shader_stage->subroutine1_uniform_location);
  (**(code **)(lVar3 + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine2_uniform_location,(long)&local_1d8 + 4)
  ;
  (**(code **)(lVar3 + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine3_uniform_location,&uStack_1d0);
  (**(code **)(lVar3 + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine4_uniform_location,(long)&uStack_1d0 + 4
            );
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glGetUniformSubroutineuiv() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x226d);
  if (*verification == SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES) {
    if (((((GLuint)local_1d8 == shader_stage->default_subroutine1_value) &&
         (local_1d8._4_4_ == shader_stage->default_subroutine2_value)) &&
        ((GLuint)uStack_1d0 == shader_stage->default_subroutine3_value)) &&
       (uStack_1d0._4_4_ == shader_stage->default_subroutine4_value)) {
      return;
    }
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES validation failed. Shader stage:[",0x4b);
    Utils::getShaderStageStringFromGLEnum_abi_cxx11_
              (&local_1c8,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], expected data:[",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], found data:[",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else if (*verification == SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES) {
    if (((GLuint)local_1d8 == shader_stage->subroutine2_uniform_location ||
         (GLuint)local_1d8 == shader_stage->subroutine1_uniform_location) &&
       (local_1d8._4_4_ == shader_stage->subroutine2_uniform_location ||
        local_1d8._4_4_ == shader_stage->subroutine1_uniform_location)) {
      if (((GLuint)uStack_1d0 == shader_stage->subroutine4_uniform_location ||
           (GLuint)uStack_1d0 == shader_stage->subroutine3_uniform_location) &&
         (uStack_1d0._4_4_ == shader_stage->subroutine4_uniform_location ||
          uStack_1d0._4_4_ == shader_stage->subroutine3_uniform_location)) {
        return;
      }
    }
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES validation failed. Shader stage:[",0x49);
    Utils::getShaderStageStringFromGLEnum_abi_cxx11_
              (&local_1c8,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], expected data:[",0x12);
    std::ostream::operator<<(poVar1,shader_stage->subroutine1_uniform_location);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," OR ",4);
    std::ostream::operator<<(poVar1,shader_stage->subroutine2_uniform_location);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," x 2, ",6);
    std::ostream::operator<<(poVar1,shader_stage->subroutine3_uniform_location);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," OR ",4);
    std::ostream::operator<<(poVar1,shader_stage->subroutine4_uniform_location);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," x 2], found data:[",0x13)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if ((((GLuint)local_1d8 != shader_stage->default_subroutine1_value) &&
        (local_1d8._4_4_ != shader_stage->default_subroutine2_value)) &&
       (((GLuint)uStack_1d0 != shader_stage->default_subroutine3_value &&
        (uStack_1d0._4_4_ != shader_stage->default_subroutine4_value)))) {
      return;
    }
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES validation failed. Shader stage:[",0x4e
              );
    Utils::getShaderStageStringFromGLEnum_abi_cxx11_
              (&local_1c8,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], expected data:![",0x13)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], found data:[",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"].",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base(local_130);
  this->m_has_test_passed = false;
  return;
}

Assistant:

void FunctionalTest16::verifySubroutineUniformValuesForShaderStage(
	const _shader_stage& shader_stage, const _subroutine_uniform_value_verification& verification)
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	glw::GLuint			  result_values[4] = { 0 };

	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine1_uniform_location, result_values + 0);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine2_uniform_location, result_values + 1);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine3_uniform_location, result_values + 2);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine4_uniform_location, result_values + 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformSubroutineuiv() call(s) failed.");

	if (verification == SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES)
	{
		if (!((result_values[0] == (GLuint)shader_stage.subroutine1_uniform_location ||
			   result_values[0] == (GLuint)shader_stage.subroutine2_uniform_location) &&
			  (result_values[1] == (GLuint)shader_stage.subroutine1_uniform_location ||
			   result_values[1] == (GLuint)shader_stage.subroutine2_uniform_location) &&
			  (result_values[2] == (GLuint)shader_stage.subroutine3_uniform_location ||
			   result_values[2] == (GLuint)shader_stage.subroutine4_uniform_location) &&
			  (result_values[3] == (GLuint)shader_stage.subroutine3_uniform_location ||
			   result_values[3] == (GLuint)shader_stage.subroutine4_uniform_location)))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES validation failed. "
														   "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:["
							   << shader_stage.subroutine1_uniform_location << " OR "
							   << shader_stage.subroutine2_uniform_location << " x 2, "
							   << shader_stage.subroutine3_uniform_location << " OR "
							   << shader_stage.subroutine4_uniform_location << " x 2], "
																			   "found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
	else if (verification == SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES)
	{
		if (result_values[0] != shader_stage.default_subroutine1_value ||
			result_values[1] != shader_stage.default_subroutine2_value ||
			result_values[2] != shader_stage.default_subroutine3_value ||
			result_values[3] != shader_stage.default_subroutine4_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES validation failed. "
								  "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:["
							   << shader_stage.default_subroutine1_value << ", "
							   << shader_stage.default_subroutine2_value << ", "
							   << shader_stage.default_subroutine3_value << ", "
							   << shader_stage.default_subroutine4_value << "], "
																			"found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
	else
	{
		DE_ASSERT(verification == SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES);

		if (result_values[0] == shader_stage.default_subroutine1_value ||
			result_values[1] == shader_stage.default_subroutine2_value ||
			result_values[2] == shader_stage.default_subroutine3_value ||
			result_values[3] == shader_stage.default_subroutine4_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES validation failed. "
								  "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:!["
							   << shader_stage.default_subroutine1_value << ", "
							   << shader_stage.default_subroutine2_value << ", "
							   << shader_stage.default_subroutine3_value << ", "
							   << shader_stage.default_subroutine4_value << "], "
																			"found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
}